

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

SegmentAnd<capnp::word_*>
capnp::_::WireHelpers::copyPointer
          (SegmentBuilder *dstSegment,CapTableBuilder *dstCapTable,WirePointer *dst,
          SegmentReader *srcSegment,CapTableReader *srcCapTable,WirePointer *src,word *srcTarget,
          int nestingLimit,BuilderArena *orphanArena,bool canonical)

{
  byte bVar1;
  ulong uVar2;
  word *pwVar3;
  SegmentBuilder *pSVar4;
  Arena *pAVar5;
  SegmentAnd<capnp::word_*> SVar6;
  StructReader value;
  ListReader value_00;
  void *pvVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  SegmentReader *extraout_RAX;
  SegmentReader *extraout_RAX_00;
  SegmentReader *pSVar10;
  SegmentReader *extraout_RAX_01;
  SegmentBuilder *pSVar11;
  SegmentBuilder *extraout_RAX_02;
  SegmentBuilder *extraout_RAX_03;
  SegmentBuilder *extraout_RAX_04;
  SegmentBuilder *extraout_RAX_05;
  SegmentBuilder *extraout_RAX_06;
  SegmentBuilder *extraout_RAX_07;
  SegmentBuilder *extraout_RAX_08;
  SegmentBuilder *extraout_RAX_09;
  char *pcVar12;
  SegmentBuilder *extraout_RAX_10;
  SegmentBuilder *extraout_RAX_11;
  SegmentBuilder *extraout_RAX_12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  Arena *pAVar16;
  Arena *pAVar17;
  uint uVar18;
  word *extraout_RDX;
  word *pwVar19;
  word *extraout_RDX_00;
  word *extraout_RDX_01;
  word *extraout_RDX_02;
  word *extraout_RDX_03;
  Arena *extraout_RDX_04;
  word *extraout_RDX_05;
  Arena *extraout_RDX_06;
  Arena *pAVar20;
  Arena *extraout_RDX_07;
  Arena *extraout_RDX_08;
  Arena *extraout_RDX_09;
  Arena *extraout_RDX_10;
  Arena *extraout_RDX_11;
  Arena *extraout_RDX_12;
  Arena *extraout_RDX_13;
  Arena *extraout_RDX_14;
  Arena *extraout_RDX_15;
  Arena *extraout_RDX_16;
  Arena *extraout_RDX_17;
  WirePointer *pWVar21;
  SegmentReader **ppSVar22;
  byte bVar23;
  char cVar24;
  ulong uVar25;
  SegmentReader **ppSVar26;
  CapTableBuilder *capTable;
  bool bVar27;
  bool bVar28;
  SegmentAnd<capnp::word_*> SVar29;
  undefined4 uVar30;
  SegmentReader *srcSegment_local;
  SegmentReader *newSegment;
  void *local_110;
  CapTableBuilder *local_108;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> _kjCondition;
  Fault f_2;
  undefined4 local_c0;
  undefined4 uStack_bc;
  undefined4 uStack_9c;
  undefined4 uStack_94;
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined4 uStack_6c;
  undefined4 uStack_64;
  undefined2 uStack_3a;
  undefined4 uStack_34;
  undefined4 extraout_var_00;
  
  uVar13 = (src->offsetAndKind).value;
  uVar18 = (src->field_1).upper32Bits | uVar13;
  srcSegment_local = srcSegment;
  if (uVar18 == 0) goto LAB_0018cc30;
  pwVar19 = (word *)(ulong)CONCAT31((int3)(uVar18 >> 8),srcSegment == (SegmentReader *)0x0);
  pSVar10 = (SegmentReader *)0x0;
  pWVar21 = src;
  local_108 = dstCapTable;
  if ((uVar13 & 3) == 2 && srcSegment != (SegmentReader *)0x0) {
    iVar8 = (*srcSegment->arena->_vptr_Arena[2])();
    srcSegment_local = (SegmentReader *)CONCAT44(extraout_var,iVar8);
    _kjCondition.left = &srcSegment_local;
    _kjCondition.right = (void *)0x0;
    _kjCondition.op.content.ptr = " != ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = srcSegment_local != (SegmentReader *)0x0;
    if (srcSegment_local == (SegmentReader *)0x0) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                ((Fault *)&newSegment,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x244,FAILED,"segment != nullptr",
                 "_kjCondition,\"Message contains far pointer to unknown segment.\"",&_kjCondition,
                 (char (*) [49])"Message contains far pointer to unknown segment.");
      kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
      pSVar10 = extraout_RAX;
      pwVar19 = extraout_RDX;
      srcTarget = (word *)(SegmentReader *)0x0;
    }
    else {
      uVar13 = (src->offsetAndKind).value;
      uVar14 = (ulong)(uVar13 >> 3);
      uVar2 = (srcSegment_local->ptr).size_;
      if ((long)uVar2 < (long)uVar14) {
        uVar14 = uVar2;
      }
      pWVar21 = (WirePointer *)((srcSegment_local->ptr).ptr + uVar14);
      if (srcSegment_local == (SegmentReader *)0x0) {
        newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,1);
LAB_0018c110:
        if (((src->offsetAndKind).value & 4) == 0) {
          pSVar10 = (SegmentReader *)(pWVar21 + 1);
          lVar15 = (long)((int)(pWVar21->offsetAndKind).value >> 2);
          dstCapTable = local_108;
          if (srcSegment_local == (SegmentReader *)0x0) {
            pwVar19 = (word *)0x0;
            srcTarget = (word *)((WireValue<uint32_t> *)&pSVar10->arena + lVar15 * 2);
          }
          else {
            pwVar3 = (srcSegment_local->ptr).ptr;
            pwVar19 = (word *)(srcSegment_local->ptr).size_;
            srcTarget = pwVar3 + (long)pwVar19;
            if ((long)pwVar3 - (long)pSVar10 >> 3 <= lVar15) {
              pwVar19 = (word *)((long)srcTarget - (long)pSVar10 >> 3);
              pSVar10 = (SegmentReader *)((WireValue<uint32_t> *)&pSVar10->arena + lVar15 * 2);
              if (lVar15 <= (long)pwVar19) {
                srcTarget = (word *)pSVar10;
              }
            }
          }
        }
        else {
          iVar8 = (*srcSegment_local->arena->_vptr_Arena[2])
                            (srcSegment_local->arena,(ulong)(pWVar21->field_1).upper32Bits);
          pSVar10 = (SegmentReader *)CONCAT44(extraout_var_00,iVar8);
          _kjCondition.left = &newSegment;
          _kjCondition.right = (void *)0x0;
          _kjCondition.op.content.ptr = " != ";
          _kjCondition.op.content.size_ = 5;
          _kjCondition.result = pSVar10 != (SegmentReader *)0x0;
          newSegment = pSVar10;
          if (pSVar10 == (SegmentReader *)0x0) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                      (&f_2,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x25f,FAILED,"newSegment != nullptr",
                       "_kjCondition,\"Message contains double-far pointer to unknown segment.\"",
                       &_kjCondition,
                       (char (*) [56])"Message contains double-far pointer to unknown segment.");
LAB_0018c2cd:
            srcTarget = (word *)0x0;
            kj::_::Debug::Fault::~Fault(&f_2);
            pSVar10 = extraout_RAX_01;
            pwVar19 = extraout_RDX_01;
          }
          else {
            uVar13 = (pWVar21->offsetAndKind).value & 3;
            _kjCondition.left = (SegmentReader **)CONCAT44(2,uVar13);
            pwVar19 = (word *)0x204108;
            _kjCondition.right = " == ";
            _kjCondition.op.content.ptr = (char *)0x5;
            _kjCondition.op.content.size_ = (size_t)(uVar13 == 2);
            if (uVar13 != 2) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                        (&f_2,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                         "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                         (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                          *)&_kjCondition,
                         (char (*) [51])"Second word of double-far pad must be far pointer.");
              goto LAB_0018c2cd;
            }
            uVar14 = (ulong)((pWVar21->offsetAndKind).value >> 3);
            uVar2 = (pSVar10->ptr).size_;
            if ((long)uVar2 < (long)uVar14) {
              uVar14 = uVar2;
            }
            srcTarget = (pSVar10->ptr).ptr + uVar14;
            srcSegment_local = pSVar10;
          }
          pWVar21 = pWVar21 + 1;
          dstCapTable = local_108;
        }
      }
      else {
        uVar25 = 2 - (ulong)((uVar13 & 4) == 0);
        if (uVar2 < uVar14 + uVar25) {
          newSegment = (SegmentReader *)((ulong)newSegment._1_7_ << 8);
        }
        else {
          uVar2 = srcSegment_local->readLimiter->limit;
          if (uVar2 < uVar25) {
            (*srcSegment_local->arena->_vptr_Arena[3])();
          }
          else {
            srcSegment_local->readLimiter->limit = uVar2 - uVar25;
          }
          newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,uVar25 <= uVar2);
          if (uVar25 <= uVar2) goto LAB_0018c110;
        }
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                   "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                   ,(DebugExpression<bool> *)&newSegment,
                   (char (*) [318])
                   "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                  );
        kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
        pSVar10 = extraout_RAX_00;
        pwVar19 = extraout_RDX_00;
        pWVar21 = src;
        srcTarget = (word *)(SegmentReader *)0x0;
        dstCapTable = local_108;
      }
    }
  }
  capTable = local_108;
  bVar28 = canonical;
  bVar27 = (SegmentReader *)srcTarget == (SegmentReader *)0x0;
  SVar29.segment._1_7_ = (int7)((ulong)pSVar10 >> 8);
  SVar29.segment._0_1_ = bVar27;
  SVar29.value = pwVar19;
  if (bVar27) {
    cVar24 = bVar27 * '\x02';
  }
  else {
    pAVar20 = (Arena *)CONCAT71((int7)((ulong)pwVar19 >> 8),canonical);
    uVar13 = (pWVar21->offsetAndKind).value;
    pSVar11 = (SegmentBuilder *)
              ((long)&switchD_0018c313::switchdataD_002062d8 +
              (long)(int)(&switchD_0018c313::switchdataD_002062d8)[uVar13 & 3]);
    uVar30 = (undefined4)((ulong)srcCapTable >> 0x20);
    switch(uVar13 & 3) {
    case 0:
      _kjCondition.left = (SegmentReader **)&nestingLimit;
      _kjCondition.right = (void *)((ulong)_kjCondition.right._4_4_ << 0x20);
      _kjCondition.op.content.ptr = " > ";
      _kjCondition.op.content.size_ = 4;
      _kjCondition.result = 0 < nestingLimit;
      if (nestingLimit < 1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[76]>
                  ((Fault *)&newSegment,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x7bc,FAILED,"nestingLimit > 0",
                   "_kjCondition,\"Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.\""
                   ,(DebugComparison<int_&,_int> *)&_kjCondition,
                   (char (*) [76])
                   "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.");
        kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
        pSVar11 = extraout_RAX_02;
        pwVar19 = extraout_RDX_02;
        goto LAB_0018c603;
      }
      pSVar11 = (SegmentBuilder *)srcSegment_local;
      if (srcSegment_local == (SegmentReader *)0x0) {
        bVar28 = true;
      }
      else {
        pAVar16 = (Arena *)((ulong)(pWVar21->field_1).structRef.dataSize.value +
                           (ulong)(pWVar21->field_1).structRef.ptrCount.value);
        pAVar20 = (Arena *)((long)&pAVar16->_vptr_Arena +
                           ((long)srcTarget - (long)(srcSegment_local->ptr).ptr >> 3));
        if ((Arena *)(srcSegment_local->ptr).size_ < pAVar20) {
          bVar28 = false;
        }
        else {
          pSVar11 = (SegmentBuilder *)srcSegment_local->readLimiter;
          pAVar17 = (pSVar11->super_SegmentReader).arena;
          pAVar20 = (Arena *)((long)pAVar17 - (long)pAVar16);
          bVar28 = pAVar17 >= pAVar16;
          if (pAVar17 < pAVar16) {
            iVar8 = (*srcSegment_local->arena->_vptr_Arena[3])();
            pSVar11 = (SegmentBuilder *)CONCAT44(extraout_var_01,iVar8);
            pAVar20 = extraout_RDX_13;
          }
          else {
            (pSVar11->super_SegmentReader).arena = pAVar20;
          }
        }
      }
      newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,bVar28);
      cVar24 = '\0';
      if (bVar28 == false) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[322]>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x7c2,FAILED,"boundsCheck(srcSegment, ptr, src->structRef.wordSize())",
                   "_kjCondition,\"Message contained out-of-bounds struct pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                   ,(DebugExpression<bool> *)&newSegment,
                   (char (*) [322])
                   "Message contained out-of-bounds struct pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                  );
        kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
        cVar24 = '\x02';
        pSVar11 = extraout_RAX_06;
        pAVar20 = extraout_RDX_06;
      }
      capTable = local_108;
      SVar29.value = (word *)pAVar20;
      SVar29.segment = pSVar11;
      dstCapTable = local_108;
      if (bVar28 != false) {
        iVar8 = (uint)*(ushort *)&pWVar21->field_1 << 6;
        value.capTable._0_4_ = (int)srcCapTable;
        value.segment = srcSegment_local;
        value.capTable._4_4_ = uVar30;
        value.data._0_4_ = (int)srcTarget;
        value.data._4_4_ = (int)((ulong)srcTarget >> 0x20);
        value.pointers._0_4_ =
             (int)((WireValue<uint32_t> *)&((SegmentReader *)srcTarget)->arena +
                  (ulong)*(ushort *)&pWVar21->field_1 * 2);
        value.pointers._4_4_ =
             (int)((ulong)((WireValue<uint32_t> *)&((SegmentReader *)srcTarget)->arena +
                          (ulong)*(ushort *)&pWVar21->field_1 * 2) >> 0x20);
        value.dataSize = iVar8;
        value._36_4_ = (int)(CONCAT26(uStack_3a,
                                      CONCAT24((pWVar21->field_1).structRef.ptrCount.value,iVar8))
                            >> 0x20);
        value.nestingLimit = nestingLimit + -1;
        value._44_4_ = uStack_34;
        SVar29 = setStructPointer(dstSegment,local_108,dst,value,orphanArena,canonical);
LAB_0018cc20:
        cVar24 = '\x01';
        dstCapTable = capTable;
      }
      break;
    case 1:
      bVar1 = *(byte *)&pWVar21->field_1;
      _kjCondition.left = (SegmentReader **)&nestingLimit;
      _kjCondition.right = (void *)((ulong)_kjCondition.right._4_4_ << 0x20);
      _kjCondition.op.content.ptr = " > ";
      _kjCondition.op.content.size_ = 4;
      _kjCondition.result = 0 < nestingLimit;
      if (nestingLimit < 1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[76]>
                  ((Fault *)&newSegment,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x7d1,FAILED,"nestingLimit > 0",
                   "_kjCondition,\"Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.\""
                   ,(DebugComparison<int_&,_int> *)&_kjCondition,
                   (char (*) [76])
                   "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.");
        kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
        pSVar11 = extraout_RAX_05;
        pwVar19 = extraout_RDX_05;
        goto LAB_0018c603;
      }
      bVar23 = bVar1 & 7;
      dstCapTable = capTable;
      if (bVar23 == 7) {
        f_2.exception._0_4_ = (pWVar21->field_1).upper32Bits >> 3;
        pSVar11 = (SegmentBuilder *)(ulong)(uint)f_2.exception;
        if (srcSegment_local == (SegmentReader *)0x0) {
          bVar28 = true;
        }
        else {
          pAVar20 = (Arena *)((long)&(pSVar11->super_SegmentReader).arena +
                             ((long)srcTarget - (long)(srcSegment_local->ptr).ptr >> 3) + 1);
          if ((Arena *)(srcSegment_local->ptr).size_ < pAVar20) {
            bVar28 = false;
          }
          else {
            pSVar11 = (SegmentBuilder *)((long)&(pSVar11->super_SegmentReader).arena + 1);
            pSVar4 = (SegmentBuilder *)srcSegment_local->readLimiter->limit;
            pAVar20 = (Arena *)((long)pSVar4 - (long)pSVar11);
            bVar28 = pSVar4 >= pSVar11;
            if (pSVar4 < pSVar11) {
              iVar8 = (*srcSegment_local->arena->_vptr_Arena[3])();
              pSVar11 = (SegmentBuilder *)CONCAT44(extraout_var_02,iVar8);
              pAVar20 = extraout_RDX_14;
            }
            else {
              srcSegment_local->readLimiter->limit = (uint64_t)pAVar20;
            }
          }
        }
        newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,bVar28);
        cVar24 = '\0';
        if (bVar28 == false) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[319]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x7db,FAILED,"boundsCheck(srcSegment, ptr, wordCount + POINTER_SIZE_IN_WORDS)"
                     ,
                     "_kjCondition,\"Message contains out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)&newSegment,
                     (char (*) [319])
                     "Message contains out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
          kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
          cVar24 = '\x02';
          pSVar11 = extraout_RAX_07;
          pAVar20 = extraout_RDX_07;
        }
        SVar29.value = (word *)pAVar20;
        SVar29.segment = pSVar11;
        if (bVar28 != false) {
          uVar13 = ((WireValue<uint32_t> *)&((SegmentReader *)srcTarget)->arena)->value & 3;
          _kjCondition.left = (SegmentReader **)(ulong)uVar13;
          pSVar11 = (SegmentBuilder *)0x204108;
          _kjCondition.right = " == ";
          _kjCondition.op.content.ptr = (char *)0x5;
          _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar13 == 0);
          if (uVar13 == 0) {
            cVar24 = '\0';
          }
          else {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[61]>
                      ((Fault *)&newSegment,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x7e2,FAILED,"tag->kind() == WirePointer::STRUCT",
                       "_kjCondition,\"INLINE_COMPOSITE lists of non-STRUCT type are not supported.\""
                       ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *
                        )&_kjCondition,
                       (char (*) [61])"INLINE_COMPOSITE lists of non-STRUCT type are not supported."
                      );
            kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
            cVar24 = '\x02';
            pSVar11 = extraout_RAX_08;
            pAVar20 = extraout_RDX_08;
          }
          SVar29.value = (word *)pAVar20;
          SVar29.segment = pSVar11;
          if (uVar13 == 0) {
            uVar13 = ((WireValue<uint32_t> *)&((SegmentReader *)srcTarget)->arena)->value >> 2 &
                     0x1fffffff;
            pAVar16 = (Arena *)(ulong)uVar13;
            uVar18 = (uint)*(ushort *)
                            ((long)&(((anon_union_4_5_35ddcec3_for_WirePointer_1 *)
                                     ((WireValue<uint32_t> *)&((SegmentReader *)srcTarget)->arena +
                                     1))->listRef).elementSizeAndCount.value + 2) +
                     (uint)(((anon_union_4_5_35ddcec3_for_WirePointer_1 *)
                            ((WireValue<uint32_t> *)&((SegmentReader *)srcTarget)->arena + 1))->
                           structRef).dataSize.value;
            ppSVar22 = (SegmentReader **)((ulong)uVar18 * (long)pAVar16);
            _kjCondition.right = &f_2;
            ppSVar26 = (SegmentReader **)(ulong)(uint)f_2.exception;
            cVar24 = '\0';
            pcVar12 = " <= ";
            _kjCondition.op.content.ptr = " <= ";
            _kjCondition.op.content.size_ = 5;
            bVar28 = (long)ppSVar22 - (long)ppSVar26 == 0;
            _kjCondition.result = ppSVar22 < ppSVar26 || bVar28;
            _kjCondition.left = ppSVar22;
            if (ppSVar22 >= ppSVar26 && !bVar28) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int&>&,char_const(&)[57]>
                        ((Fault *)&newSegment,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x7ea,FAILED,
                         "wordsPerElement * upgradeBound<uint64_t>(elementCount) <= wordCount",
                         "_kjCondition,\"INLINE_COMPOSITE list\'s elements overrun its word count.\""
                         ,(DebugComparison<unsigned_long,_unsigned_int_&> *)&_kjCondition,
                         (char (*) [57])"INLINE_COMPOSITE list\'s elements overrun its word count.")
              ;
              kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
              cVar24 = '\x02';
              pcVar12 = (char *)extraout_RAX_10;
              pAVar20 = extraout_RDX_10;
            }
            capTable = local_108;
            SVar29.value = (word *)pAVar20;
            SVar29.segment = (SegmentBuilder *)pcVar12;
            dstCapTable = capTable;
            if (ppSVar22 < ppSVar26 || (long)ppSVar22 - (long)ppSVar26 == 0) {
              if (uVar18 == 0) {
                if (srcSegment_local == (SegmentReader *)0x0) {
                  bVar28 = true;
                  pSVar11 = (SegmentBuilder *)0x0;
                }
                else {
                  pSVar11 = (SegmentBuilder *)srcSegment_local->readLimiter;
                  pAVar17 = (pSVar11->super_SegmentReader).arena;
                  bVar28 = pAVar17 >= pAVar16;
                  if (pAVar17 < pAVar16) {
                    iVar8 = (*srcSegment_local->arena->_vptr_Arena[3])();
                    pSVar11 = (SegmentBuilder *)CONCAT44(extraout_var_05,iVar8);
                    pAVar20 = extraout_RDX_17;
                  }
                  else {
                    (pSVar11->super_SegmentReader).arena = (Arena *)((long)pAVar17 - (long)pAVar16);
                  }
                }
                newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,bVar28);
                cVar24 = '\0';
                if (bVar28 == false) {
                  kj::_::Debug::Fault::
                  Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
                            ((Fault *)&_kjCondition,
                             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                             ,0x7f2,FAILED,
                             "amplifiedRead(srcSegment, elementCount * (ONE * WORDS / ELEMENTS))",
                             "_kjCondition,\"Message contains amplified list pointer.\"",
                             (DebugExpression<bool> *)&newSegment,
                             (char (*) [41])"Message contains amplified list pointer.");
                  kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
                  cVar24 = '\x02';
                  pSVar11 = extraout_RAX_12;
                  pAVar20 = extraout_RDX_12;
                }
                SVar29.value = (word *)pAVar20;
                SVar29.segment = pSVar11;
                if (bVar28 == false) break;
              }
              uVar18 = uVar18 * 0x40;
              iVar8 = (uint)(((anon_union_4_5_35ddcec3_for_WirePointer_1 *)
                             ((WireValue<uint32_t> *)&((SegmentReader *)srcTarget)->arena + 1))->
                            structRef).dataSize.value << 6;
              uStack_6c._0_3_ =
                   CONCAT12(7,*(undefined2 *)
                               ((long)&(((anon_union_4_5_35ddcec3_for_WirePointer_1 *)
                                        ((WireValue<uint32_t> *)&((SegmentReader *)srcTarget)->arena
                                        + 1))->listRef).elementSizeAndCount.value + 2));
              local_90 = SUB84(srcSegment_local,0);
              uStack_8c = (undefined4)((ulong)srcSegment_local >> 0x20);
              srcTarget = (word *)&((SegmentReader *)srcTarget)->id;
              goto LAB_0018cbf3;
            }
          }
        }
      }
      else {
        iVar8 = (&BITS_PER_ELEMENT_TABLE)[(ulong)bVar1 & 7];
        uVar18 = (uint)(bVar23 == 6) * 0x40 + iVar8;
        uVar13 = (pWVar21->field_1).upper32Bits >> 3;
        pAVar16 = (Arena *)(ulong)uVar13;
        pSVar11 = (SegmentBuilder *)srcSegment_local;
        if (srcSegment_local == (SegmentReader *)0x0) {
          bVar28 = true;
        }
        else {
          pAVar17 = (Arena *)((ulong)uVar18 * (long)pAVar16 + 0x3f >> 6 & 0xffffffff);
          pAVar20 = (Arena *)((long)&pAVar17->_vptr_Arena +
                             ((long)srcTarget - (long)(srcSegment_local->ptr).ptr >> 3));
          if ((Arena *)(srcSegment_local->ptr).size_ < pAVar20) {
            bVar28 = false;
          }
          else {
            pSVar11 = (SegmentBuilder *)srcSegment_local->readLimiter;
            pAVar5 = (pSVar11->super_SegmentReader).arena;
            pAVar20 = (Arena *)((long)pAVar5 - (long)pAVar17);
            bVar28 = pAVar5 >= pAVar17;
            if (pAVar5 < pAVar17) {
              iVar9 = (*srcSegment_local->arena->_vptr_Arena[3])();
              pSVar11 = (SegmentBuilder *)CONCAT44(extraout_var_03,iVar9);
              pAVar20 = extraout_RDX_15;
            }
            else {
              (pSVar11->super_SegmentReader).arena = pAVar20;
            }
          }
        }
        newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,bVar28);
        cVar24 = '\0';
        if (bVar28 == false) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[319]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x807,FAILED,"boundsCheck(srcSegment, ptr, wordCount)",
                     "_kjCondition,\"Message contains out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)&newSegment,
                     (char (*) [319])
                     "Message contains out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
          kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
          cVar24 = '\x02';
          pSVar11 = extraout_RAX_09;
          pAVar20 = extraout_RDX_09;
        }
        SVar29.value = (word *)pAVar20;
        SVar29.segment = pSVar11;
        if (bVar28 != false) {
          if (bVar23 == 0) {
            if (srcSegment_local == (SegmentReader *)0x0) {
              bVar28 = true;
              pSVar11 = (SegmentBuilder *)0x0;
            }
            else {
              pSVar11 = (SegmentBuilder *)srcSegment_local->readLimiter;
              pAVar17 = (pSVar11->super_SegmentReader).arena;
              bVar28 = pAVar17 >= pAVar16;
              if (pAVar17 < pAVar16) {
                iVar9 = (*srcSegment_local->arena->_vptr_Arena[3])();
                pSVar11 = (SegmentBuilder *)CONCAT44(extraout_var_04,iVar9);
                pAVar20 = extraout_RDX_16;
              }
              else {
                (pSVar11->super_SegmentReader).arena = (Arena *)((long)pAVar17 - (long)pAVar16);
              }
            }
            newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,bVar28);
            cVar24 = '\0';
            if (bVar28 == false) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
                        ((Fault *)&_kjCondition,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x80f,FAILED,
                         "amplifiedRead(srcSegment, elementCount * (ONE * WORDS / ELEMENTS))",
                         "_kjCondition,\"Message contains amplified list pointer.\"",
                         (DebugExpression<bool> *)&newSegment,
                         (char (*) [41])"Message contains amplified list pointer.");
              kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
              cVar24 = '\x02';
              pSVar11 = extraout_RAX_11;
              pAVar20 = extraout_RDX_11;
            }
            SVar29.value = (word *)pAVar20;
            SVar29.segment = pSVar11;
            if (bVar28 == false) break;
          }
          uStack_9c = CONCAT13(uStack_9c._3_1_,CONCAT12(bVar1,(ushort)(bVar23 == 6))) & 0xff07ffff;
          local_c0 = SUB84(srcSegment_local,0);
          uStack_bc = (undefined4)((ulong)srcSegment_local >> 0x20);
          local_90 = local_c0;
          uStack_8c = uStack_bc;
          uStack_6c = uStack_9c;
          uStack_64 = uStack_94;
LAB_0018cbf3:
          value_00.segment._4_4_ = uStack_8c;
          value_00.segment._0_4_ = local_90;
          value_00.capTable._0_4_ = (int)srcCapTable;
          value_00.capTable._4_4_ = uVar30;
          value_00.ptr._0_4_ = (int)srcTarget;
          value_00.ptr._4_4_ = (int)((ulong)srcTarget >> 0x20);
          value_00.elementCount = uVar13;
          value_00.step = uVar18;
          value_00.structDataSize = iVar8;
          value_00.structPointerCount = (short)uStack_6c;
          value_00.elementSize = (char)(uStack_6c >> 0x10);
          value_00._39_1_ = (char)(uStack_6c >> 0x18);
          value_00.nestingLimit = nestingLimit + -1;
          value_00._44_4_ = uStack_64;
          SVar29 = setListPointer(dstSegment,capTable,dst,value_00,orphanArena,canonical);
          goto LAB_0018cc20;
        }
      }
      break;
    case 2:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x81c,FAILED,(char *)0x0,"\"Unexpected FAR pointer.\"",
                 (char (*) [24])"Unexpected FAR pointer.");
      kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
      pSVar11 = extraout_RAX_03;
      pwVar19 = extraout_RDX_03;
LAB_0018c603:
      cVar24 = '\x02';
      SVar29.value = pwVar19;
      SVar29.segment = pSVar11;
      dstCapTable = local_108;
      break;
    case 3:
      cVar24 = '\0';
      newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,uVar13 == 3);
      if (uVar13 != 3) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[22]>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x821,FAILED,"src->isCapability()","_kjCondition,\"Unknown pointer type.\"",
                   (DebugExpression<bool> *)&newSegment,(char (*) [22])"Unknown pointer type.");
        kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
        cVar24 = '\x02';
        pSVar11 = extraout_RAX_04;
        pAVar20 = extraout_RDX_04;
      }
      dstCapTable = local_108;
      SVar29.value = (word *)pAVar20;
      SVar29.segment = pSVar11;
      if (uVar13 == 3) {
        if (bVar28 != false) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[52]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x826,FAILED,(char *)0x0,
                     "\"Cannot create a canonical message with a capability\"",
                     (char (*) [52])"Cannot create a canonical message with a capability");
          kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
        }
        (**srcCapTable->_vptr_CapTableReader)
                  (&newSegment,srcCapTable,(ulong)(pWVar21->field_1).upper32Bits);
        _kjCondition.left = (SegmentReader **)newSegment;
        _kjCondition.right = local_110;
        if (local_110 == (void *)0x0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[46]>
                    ((Fault *)&newSegment,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x831,FAILED,(char *)0x0,"\"Message contained invalid capability pointer.\"",
                     (char (*) [46])"Message contained invalid capability pointer.");
          kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
          cVar24 = '\x02';
        }
        else {
          cVar24 = '\x01';
          setCapabilityPointer
                    (dstSegment,dstCapTable,dst,
                     (Own<capnp::ClientHook,_std::nullptr_t> *)&_kjCondition);
        }
        pvVar7 = _kjCondition.right;
        if (_kjCondition.right != (void *)0x0) {
          _kjCondition.right = (void *)0x0;
          (*(code *)(*_kjCondition.left)->arena)
                    (_kjCondition.left,(long)pvVar7 + *(long *)(*pvVar7 + -0x10));
        }
        SVar29.value = (word *)0x1;
        SVar29.segment = dstSegment;
      }
    }
  }
  if (cVar24 != '\x02') {
    return SVar29;
  }
LAB_0018cc30:
  if ((dst->field_1).upper32Bits != 0 || (dst->offsetAndKind).value != 0) {
    zeroObject(dstSegment,dstCapTable,dst);
    dst->offsetAndKind = 0;
    dst->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  }
  SVar6.value = (word *)0x0;
  SVar6.segment = dstSegment;
  return SVar6;
}

Assistant:

static SegmentAnd<word*> copyPointer(
      SegmentBuilder* dstSegment, CapTableBuilder* dstCapTable, WirePointer* dst,
      SegmentReader* srcSegment, CapTableReader* srcCapTable, const WirePointer* src,
      const word* srcTarget, int nestingLimit,
      BuilderArena* orphanArena = nullptr, bool canonical = false) {
    // Deep-copy the object pointed to by src into dst.  It turns out we can't reuse
    // readStructPointer(), etc. because they do type checking whereas here we want to accept any
    // valid pointer.

    if (src->isNull()) {
    useDefault:
      if (!dst->isNull()) {
        zeroObject(dstSegment, dstCapTable, dst);
        zeroMemory(dst);
      }
      return { dstSegment, nullptr };
    }

    const word* ptr;
    KJ_IF_SOME(p, WireHelpers::followFars(src, srcTarget, srcSegment)) {
      ptr = &p;
    } else {
      goto useDefault;
    }

    switch (src->kind()) {
      case WirePointer::STRUCT:
        KJ_REQUIRE(nestingLimit > 0,
              "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.") {
          goto useDefault;
        }

        KJ_REQUIRE(boundsCheck(srcSegment, ptr, src->structRef.wordSize()),
                   "Message contained out-of-bounds struct pointer. "
                   OUT_OF_BOUNDS_ERROR_DETAIL) {
          goto useDefault;
        }
        return setStructPointer(dstSegment, dstCapTable, dst,
            StructReader(srcSegment, srcCapTable, ptr,
                         reinterpret_cast<const WirePointer*>(ptr + src->structRef.dataSize.get()),
                         src->structRef.dataSize.get() * BITS_PER_WORD,
                         src->structRef.ptrCount.get(),
                         nestingLimit - 1),
            orphanArena, canonical);

      case WirePointer::LIST: {
        ElementSize elementSize = src->listRef.elementSize();

        KJ_REQUIRE(nestingLimit > 0,
              "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.") {
          goto useDefault;
        }

        if (elementSize == ElementSize::INLINE_COMPOSITE) {
          auto wordCount = src->listRef.inlineCompositeWordCount();
          const WirePointer* tag = reinterpret_cast<const WirePointer*>(ptr);

          KJ_REQUIRE(boundsCheck(srcSegment, ptr, wordCount + POINTER_SIZE_IN_WORDS),
                     "Message contains out-of-bounds list pointer. "
                     OUT_OF_BOUNDS_ERROR_DETAIL) {
            goto useDefault;
          }

          ptr += POINTER_SIZE_IN_WORDS;

          KJ_REQUIRE(tag->kind() == WirePointer::STRUCT,
                     "INLINE_COMPOSITE lists of non-STRUCT type are not supported.") {
            goto useDefault;
          }

          auto elementCount = tag->inlineCompositeListElementCount();
          auto wordsPerElement = tag->structRef.wordSize() / ELEMENTS;

          KJ_REQUIRE(wordsPerElement * upgradeBound<uint64_t>(elementCount) <= wordCount,
                     "INLINE_COMPOSITE list's elements overrun its word count.") {
            goto useDefault;
          }

          if (wordsPerElement * (ONE * ELEMENTS) == ZERO * WORDS) {
            // Watch out for lists of zero-sized structs, which can claim to be arbitrarily large
            // without having sent actual data.
            KJ_REQUIRE(amplifiedRead(srcSegment, elementCount * (ONE * WORDS / ELEMENTS)),
                       "Message contains amplified list pointer.") {
              goto useDefault;
            }
          }

          return setListPointer(dstSegment, dstCapTable, dst,
              ListReader(srcSegment, srcCapTable, ptr,
                         elementCount, wordsPerElement * BITS_PER_WORD,
                         tag->structRef.dataSize.get() * BITS_PER_WORD,
                         tag->structRef.ptrCount.get(), ElementSize::INLINE_COMPOSITE,
                         nestingLimit - 1),
              orphanArena, canonical);
        } else {
          auto dataSize = dataBitsPerElement(elementSize) * ELEMENTS;
          auto pointerCount = pointersPerElement(elementSize) * ELEMENTS;
          auto step = (dataSize + pointerCount * BITS_PER_POINTER) / ELEMENTS;
          auto elementCount = src->listRef.elementCount();
          auto wordCount = roundBitsUpToWords(upgradeBound<uint64_t>(elementCount) * step);

          KJ_REQUIRE(boundsCheck(srcSegment, ptr, wordCount),
                     "Message contains out-of-bounds list pointer. "
                     OUT_OF_BOUNDS_ERROR_DETAIL) {
            goto useDefault;
          }

          if (elementSize == ElementSize::VOID) {
            // Watch out for lists of void, which can claim to be arbitrarily large without having
            // sent actual data.
            KJ_REQUIRE(amplifiedRead(srcSegment, elementCount * (ONE * WORDS / ELEMENTS)),
                       "Message contains amplified list pointer.") {
              goto useDefault;
            }
          }

          return setListPointer(dstSegment, dstCapTable, dst,
              ListReader(srcSegment, srcCapTable, ptr, elementCount, step, dataSize, pointerCount,
                         elementSize, nestingLimit - 1),
              orphanArena, canonical);
        }
      }

      case WirePointer::FAR:
        KJ_FAIL_REQUIRE("Unexpected FAR pointer.") {
          goto useDefault;
        }

      case WirePointer::OTHER: {
        KJ_REQUIRE(src->isCapability(), "Unknown pointer type.") {
          goto useDefault;
        }

        if (canonical) {
          KJ_FAIL_REQUIRE("Cannot create a canonical message with a capability") {
            break;
          }
        }
#if !CAPNP_LITE
        KJ_IF_SOME(cap, srcCapTable->extractCap(src->capRef.index.get())) {
          setCapabilityPointer(dstSegment, dstCapTable, dst, kj::mv(cap));
          // Return dummy non-null pointer so OrphanBuilder doesn't end up null.
          return { dstSegment, reinterpret_cast<word*>(1) };
        } else {
#endif  // !CAPNP_LITE
          KJ_FAIL_REQUIRE("Message contained invalid capability pointer.") {
            goto useDefault;
          }
#if !CAPNP_LITE
        }
#endif  // !CAPNP_LITE
      }
    }

    KJ_UNREACHABLE;
  }